

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O0

void mi_free_block_local(mi_page_t *page,mi_block_t *block,_Bool track_stats,_Bool check_full)

{
  byte bVar1;
  _Bool _Var2;
  uint16_t uVar3;
  byte in_CL;
  byte bVar4;
  byte in_DL;
  mi_page_t *in_RSI;
  mi_page_t *in_RDI;
  undefined6 unaff_retaddr;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  
  bVar4 = in_DL & 1;
  bVar1 = in_CL & 1;
  _Var2 = mi_check_is_double_free(in_RDI,(mi_block_t *)in_RSI);
  if (!_Var2) {
    mi_check_padding(in_RDI,(mi_block_t *)in_RSI);
    if ((bVar4 & 1) != 0) {
      mi_stat_free(in_RDI,(mi_block_t *)in_RSI);
    }
    mi_block_set_next(in_RSI,(mi_block_t *)
                             CONCAT17(bVar4,CONCAT16(bVar1,CONCAT15(in_stack_ffffffffffffffed,
                                                                    in_stack_ffffffffffffffe8))),
                      (mi_block_t *)0xc4c59a);
    in_RDI->local_free = (mi_block_t *)in_RSI;
    uVar3 = in_RDI->used - 1;
    in_RDI->used = uVar3;
    if (uVar3 == 0) {
      _mi_page_retire((mi_page_t *)CONCAT17(track_stats,CONCAT16(check_full,unaff_retaddr)));
    }
    else {
      _Var2 = false;
      if ((bVar1 & 1) != 0) {
        _Var2 = mi_page_is_in_full(in_RDI);
      }
      if (_Var2 != false) {
        _mi_page_unfull((mi_page_t *)CONCAT17(track_stats,CONCAT16(check_full,unaff_retaddr)));
      }
    }
  }
  return;
}

Assistant:

static inline void mi_free_block_local(mi_page_t* page, mi_block_t* block, bool track_stats, bool check_full)
{
  // checks
  if mi_unlikely(mi_check_is_double_free(page, block)) return;
  mi_check_padding(page, block);
  if (track_stats) { mi_stat_free(page, block); }
  #if (MI_DEBUG>0) && !MI_TRACK_ENABLED  && !MI_TSAN && !MI_GUARDED
  if (!mi_page_is_huge(page)) {   // huge page content may be already decommitted
    memset(block, MI_DEBUG_FREED, mi_page_block_size(page));
  }
  #endif
  if (track_stats) { mi_track_free_size(block, mi_page_usable_size_of(page, block)); } // faster then mi_usable_size as we already know the page and that p is unaligned

  // actual free: push on the local free list
  mi_block_set_next(page, block, page->local_free);
  page->local_free = block;
  if mi_unlikely(--page->used == 0) {
    _mi_page_retire(page);
  }